

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_itrans.c
# Opt level: O1

void ihevc_itrans_16x16(WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,
                       WORD32 i4_shift,WORD32 zero_cols)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  undefined1 in_XMM0 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar29;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  WORD32 e [8];
  WORD32 o [8];
  int local_78 [7];
  int iStack_5c;
  int aiStack_58 [10];
  
  iVar11 = 1 << ((char)i4_shift - 1U & 0x1f);
  auVar15 = pmovsxwd(in_XMM0,0x120032004b0059);
  auVar16 = pmovsxwd(auVar15,0xffceffa7ffee004b);
  auVar22 = pmovsxwd(in_XMM2,0x4b0012ffa70032);
  auVar23 = pmovsxwd(in_XMM3,0xffa7004bffce0012);
  auVar24 = pmovzxdq(ZEXT416((uint)i4_shift),ZEXT416((uint)i4_shift));
  iVar12 = 0;
  auVar17 = auVar16;
  do {
    if ((zero_cols & 1U) == 0) {
      iVar3 = (int)pi2_src[src_strd];
      iVar4 = (int)pi2_src[src_strd * 3];
      iVar5 = (int)pi2_src[src_strd * 5];
      iVar6 = (int)pi2_src[src_strd * 7];
      iVar7 = (int)pi2_src[src_strd * 9];
      iVar8 = (int)pi2_src[src_strd * 0xb];
      iVar9 = (int)pi2_src[src_strd * 0xd];
      iVar10 = (int)pi2_src[src_strd * 0xf];
      auVar21._4_4_ = iVar3;
      auVar21._0_4_ = iVar3;
      auVar21._8_4_ = iVar3;
      auVar21._12_4_ = iVar3;
      auVar26._4_4_ = iVar4;
      auVar26._0_4_ = iVar4;
      auVar26._8_4_ = iVar4;
      auVar26._12_4_ = iVar4;
      auVar28._4_4_ = iVar5;
      auVar28._0_4_ = iVar5;
      auVar28._8_4_ = iVar5;
      auVar28._12_4_ = iVar5;
      auVar31._4_4_ = iVar6;
      auVar31._0_4_ = iVar6;
      auVar31._8_4_ = iVar6;
      auVar31._12_4_ = iVar6;
      auVar32._4_4_ = iVar7;
      auVar32._0_4_ = iVar7;
      auVar32._8_4_ = iVar7;
      auVar32._12_4_ = iVar7;
      auVar33._4_4_ = iVar8;
      auVar33._0_4_ = iVar8;
      auVar33._8_4_ = iVar8;
      auVar33._12_4_ = iVar8;
      auVar34._4_4_ = iVar9;
      auVar34._0_4_ = iVar9;
      auVar34._8_4_ = iVar9;
      auVar34._12_4_ = iVar9;
      auVar35._4_4_ = iVar10;
      auVar35._0_4_ = iVar10;
      auVar35._8_4_ = iVar10;
      auVar35._12_4_ = iVar10;
      lVar13 = 0;
      do {
        auVar36 = pmovsxwd(in_XMM15,*(undefined8 *)(g_ai2_ihevc_trans_16[1] + lVar13));
        auVar37 = pmulld(auVar36,auVar21);
        auVar17 = pmovsxwd(auVar17,*(undefined8 *)(g_ai2_ihevc_trans_16[3] + lVar13));
        auVar17 = pmulld(auVar17,auVar26);
        auVar36._0_4_ = auVar17._0_4_ + auVar37._0_4_;
        auVar36._4_4_ = auVar17._4_4_ + auVar37._4_4_;
        auVar36._8_4_ = auVar17._8_4_ + auVar37._8_4_;
        auVar36._12_4_ = auVar17._12_4_ + auVar37._12_4_;
        auVar17 = pmovsxwd(auVar37,*(undefined8 *)(g_ai2_ihevc_trans_16[5] + lVar13));
        auVar38 = pmulld(auVar17,auVar28);
        auVar17 = pmovsxwd(in_XMM1,*(undefined8 *)(g_ai2_ihevc_trans_16[7] + lVar13));
        auVar17 = pmulld(auVar17,auVar31);
        auVar37._0_4_ = auVar17._0_4_ + auVar38._0_4_ + auVar36._0_4_;
        auVar37._4_4_ = auVar17._4_4_ + auVar38._4_4_ + auVar36._4_4_;
        auVar37._8_4_ = auVar17._8_4_ + auVar38._8_4_ + auVar36._8_4_;
        auVar37._12_4_ = auVar17._12_4_ + auVar38._12_4_ + auVar36._12_4_;
        auVar17 = pmovsxwd(auVar36,*(undefined8 *)(g_ai2_ihevc_trans_16[9] + lVar13));
        auVar17 = pmulld(auVar17,auVar32);
        auVar36 = pmovsxwd(auVar38,*(undefined8 *)(g_ai2_ihevc_trans_16[0xb] + lVar13));
        auVar36 = pmulld(auVar36,auVar33);
        in_XMM15._0_4_ = auVar36._0_4_ + auVar17._0_4_;
        in_XMM15._4_4_ = auVar36._4_4_ + auVar17._4_4_;
        in_XMM15._8_4_ = auVar36._8_4_ + auVar17._8_4_;
        in_XMM15._12_4_ = auVar36._12_4_ + auVar17._12_4_;
        auVar17 = pmovsxwd(auVar17,*(undefined8 *)(g_ai2_ihevc_trans_16[0xd] + lVar13));
        auVar36 = pmulld(auVar17,auVar34);
        auVar17._0_4_ = auVar36._0_4_ + in_XMM15._0_4_ + auVar37._0_4_;
        auVar17._4_4_ = auVar36._4_4_ + in_XMM15._4_4_ + auVar37._4_4_;
        auVar17._8_4_ = auVar36._8_4_ + in_XMM15._8_4_ + auVar37._8_4_;
        auVar17._12_4_ = auVar36._12_4_ + in_XMM15._12_4_ + auVar37._12_4_;
        auVar36 = pmovsxwd(auVar37,*(undefined8 *)(g_ai2_ihevc_trans_16[0xf] + lVar13));
        auVar36 = pmulld(auVar36,auVar35);
        in_XMM1._0_4_ = auVar36._0_4_ + auVar17._0_4_;
        in_XMM1._4_4_ = auVar36._4_4_ + auVar17._4_4_;
        in_XMM1._8_4_ = auVar36._8_4_ + auVar17._8_4_;
        in_XMM1._12_4_ = auVar36._12_4_ + auVar17._12_4_;
        *(undefined1 (*) [16])(aiStack_58 + lVar13) = in_XMM1;
        lVar13 = lVar13 + 4;
      } while (lVar13 != 8);
      iVar4 = (int)pi2_src[src_strd * 0xe];
      iVar8 = (int)pi2_src[src_strd * 10];
      iVar3 = (int)pi2_src[src_strd * 6];
      iVar6 = (int)pi2_src[src_strd * 2];
      iVar9 = pi2_src[src_strd * 0xc] * 0x24 + pi2_src[src_strd * 4] * 0x53;
      iVar10 = pi2_src[src_strd * 8] * 0x40 + *pi2_src * 0x40;
      iVar7 = pi2_src[src_strd * 0xc] * -0x53 + pi2_src[src_strd * 4] * 0x24;
      iVar5 = pi2_src[src_strd * 8] * -0x40 + *pi2_src * 0x40;
      auVar38._4_4_ = iVar6;
      auVar38._0_4_ = iVar6;
      auVar38._8_4_ = iVar6;
      auVar38._12_4_ = iVar6;
      auVar17 = pmulld(auVar38,auVar15);
      auVar25._4_4_ = iVar3;
      auVar25._0_4_ = iVar3;
      auVar25._8_4_ = iVar3;
      auVar25._12_4_ = iVar3;
      auVar26 = pmulld(auVar25,auVar16);
      auVar20._4_4_ = iVar8;
      auVar20._0_4_ = iVar8;
      auVar20._8_4_ = iVar8;
      auVar20._12_4_ = iVar8;
      auVar21 = pmulld(auVar20,auVar22);
      auVar27._4_4_ = iVar4;
      auVar27._0_4_ = iVar4;
      auVar27._8_4_ = iVar4;
      auVar27._12_4_ = iVar4;
      auVar28 = pmulld(auVar27,auVar23);
      iVar6 = auVar28._0_4_ + auVar21._0_4_ + auVar26._0_4_ + auVar17._0_4_;
      iVar8 = auVar28._4_4_ + auVar21._4_4_ + auVar26._4_4_ + auVar17._4_4_;
      iVar29 = auVar28._8_4_ + auVar21._8_4_ + auVar26._8_4_ + auVar17._8_4_;
      iVar30 = auVar28._12_4_ + auVar21._12_4_ + auVar26._12_4_ + auVar17._12_4_;
      iVar3 = iVar9 + iVar10;
      iVar4 = iVar7 + iVar5;
      iVar10 = iVar10 - iVar9;
      iVar5 = iVar5 - iVar7;
      local_78[0] = iVar3 + iVar6;
      local_78[1] = iVar4 + iVar8;
      local_78[2] = iVar5 + iVar29;
      local_78[3] = iVar10 + iVar30;
      local_78[4] = iVar10 - iVar30;
      local_78[5] = iVar5 - iVar29;
      local_78[6] = iVar4 - iVar8;
      iStack_5c = iVar3 - iVar6;
      lVar14 = 8;
      lVar13 = 0;
      do {
        lVar1 = lVar13 * 2;
        lVar2 = lVar13 * 2;
        auVar18._0_4_ =
             *(int *)((long)local_78 + lVar1) + iVar11 + *(int *)((long)aiStack_58 + lVar2) >>
             auVar24;
        auVar18._4_4_ =
             *(int *)((long)local_78 + lVar1 + 4) + iVar11 + *(int *)((long)aiStack_58 + lVar2 + 4)
             >> auVar24;
        auVar18._8_4_ =
             *(int *)((long)local_78 + lVar1 + 8) + iVar11 + *(int *)((long)aiStack_58 + lVar2 + 8)
             >> auVar24;
        auVar18._12_4_ =
             *(int *)((long)local_78 + lVar1 + 0xc) + iVar11 +
             *(int *)((long)aiStack_58 + lVar2 + 0xc) >> auVar24;
        auVar17 = packssdw(auVar18,auVar18);
        *(long *)((long)pi2_dst + lVar13) = auVar17._0_8_;
        lVar1 = lVar14 * 2;
        lVar2 = lVar14 * 2;
        iVar3 = *(int *)((long)aiStack_58 + lVar2 + 4);
        iVar4 = *(int *)((long)aiStack_58 + lVar2 + 8);
        in_XMM1._4_4_ = iVar4;
        in_XMM1._0_4_ = iVar3;
        in_XMM1._8_4_ = iVar3;
        in_XMM1._12_4_ = *(int *)((long)aiStack_58 + lVar2);
        auVar19._0_4_ = (*(int *)((long)local_78 + lVar1 + 0xc) + iVar11) - iVar3 >> auVar24;
        auVar19._4_4_ = (*(int *)((long)local_78 + lVar1 + 8) + iVar11) - iVar4 >> auVar24;
        auVar19._8_4_ = (*(int *)((long)local_78 + lVar1 + 4) + iVar11) - iVar3 >> auVar24;
        auVar19._12_4_ =
             (*(int *)((long)local_78 + lVar1) + iVar11) - *(int *)((long)aiStack_58 + lVar2) >>
             auVar24;
        auVar17 = packssdw(auVar19,auVar19);
        *(long *)((long)pi2_dst + lVar13 + 0x10) = auVar17._0_8_;
        lVar13 = lVar13 + 8;
        lVar14 = lVar14 + -8;
      } while (lVar13 != 0x10);
    }
    else {
      pi2_dst[8] = 0;
      pi2_dst[9] = 0;
      pi2_dst[10] = 0;
      pi2_dst[0xb] = 0;
      pi2_dst[0xc] = 0;
      pi2_dst[0xd] = 0;
      pi2_dst[0xe] = 0;
      pi2_dst[0xf] = 0;
      pi2_dst[0] = 0;
      pi2_dst[1] = 0;
      pi2_dst[2] = 0;
      pi2_dst[3] = 0;
      pi2_dst[4] = 0;
      pi2_dst[5] = 0;
      pi2_dst[6] = 0;
      pi2_dst[7] = 0;
    }
    pi2_src = pi2_src + 1;
    pi2_dst = pi2_dst + dst_strd;
    zero_cols = zero_cols >> 1;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 0x10);
  return;
}

Assistant:

void ihevc_itrans_16x16(WORD16 *pi2_src,
                        WORD16 *pi2_dst,
                        WORD32 src_strd,
                        WORD32 dst_strd,
                        WORD32 i4_shift,
                        WORD32 zero_cols)
{
    WORD32 j, k;
    WORD32 e[8], o[8];
    WORD32 ee[4], eo[4];
    WORD32 eee[2], eeo[2];
    WORD32 add;

    add = 1 << (i4_shift - 1);

    for(j = 0; j < TRANS_SIZE_16; j++)
    {
        /* Checking for Zero Cols */
        if((zero_cols & 1) == 1)
        {
            memset(pi2_dst, 0, TRANS_SIZE_16 * sizeof(WORD16));
        }
        else
        {
            /* Utilizing symmetry properties to the maximum to minimize the number of multiplications */
            for(k = 0; k < 8; k++)
            {
                o[k] = g_ai2_ihevc_trans_16[1][k] * pi2_src[src_strd]
                                + g_ai2_ihevc_trans_16[3][k]
                                                * pi2_src[3 * src_strd]
                                + g_ai2_ihevc_trans_16[5][k]
                                                * pi2_src[5 * src_strd]
                                + g_ai2_ihevc_trans_16[7][k]
                                                * pi2_src[7 * src_strd]
                                + g_ai2_ihevc_trans_16[9][k]
                                                * pi2_src[9 * src_strd]
                                + g_ai2_ihevc_trans_16[11][k]
                                                * pi2_src[11 * src_strd]
                                + g_ai2_ihevc_trans_16[13][k]
                                                * pi2_src[13 * src_strd]
                                + g_ai2_ihevc_trans_16[15][k]
                                                * pi2_src[15 * src_strd];
            }
            for(k = 0; k < 4; k++)
            {
                eo[k] = g_ai2_ihevc_trans_16[2][k] * pi2_src[2 * src_strd]
                                + g_ai2_ihevc_trans_16[6][k]
                                                * pi2_src[6 * src_strd]
                                + g_ai2_ihevc_trans_16[10][k]
                                                * pi2_src[10 * src_strd]
                                + g_ai2_ihevc_trans_16[14][k]
                                                * pi2_src[14 * src_strd];
            }
            eeo[0] = g_ai2_ihevc_trans_16[4][0] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][0]
                                            * pi2_src[12 * src_strd];
            eee[0] =
                            g_ai2_ihevc_trans_16[0][0] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][0]
                                                            * pi2_src[8
                                                                            * src_strd];
            eeo[1] = g_ai2_ihevc_trans_16[4][1] * pi2_src[4 * src_strd]
                            + g_ai2_ihevc_trans_16[12][1]
                                            * pi2_src[12 * src_strd];
            eee[1] =
                            g_ai2_ihevc_trans_16[0][1] * pi2_src[0]
                                            + g_ai2_ihevc_trans_16[8][1]
                                                            * pi2_src[8
                                                                            * src_strd];

            /* Combining e and o terms at each hierarchy levels to calculate the final spatial domain vector */
            for(k = 0; k < 2; k++)
            {
                ee[k] = eee[k] + eeo[k];
                ee[k + 2] = eee[1 - k] - eeo[1 - k];
            }
            for(k = 0; k < 4; k++)
            {
                e[k] = ee[k] + eo[k];
                e[k + 4] = ee[3 - k] - eo[3 - k];
            }
            for(k = 0; k < 8; k++)
            {
                pi2_dst[k] =
                                CLIP_S16(((e[k] + o[k] + add) >> i4_shift));
                pi2_dst[k + 8] =
                                CLIP_S16(((e[7 - k] - o[7 - k] + add) >> i4_shift));
            }
        }
        pi2_src++;
        pi2_dst += dst_strd;
        zero_cols = zero_cols >> 1;
    }
}